

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t sse42_despace_branchless(char *bytes,size_t howmany)

{
  byte bVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [16];
  
  if (howmany < 0x10) {
    uVar4 = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    auVar8._8_4_ = 0x200a0d20;
    auVar8._0_8_ = 0x200a0d20200a0d20;
    auVar8._12_4_ = 0x200a0d20;
    uVar5 = 0;
    do {
      vpcmpestrm_avx(auVar8,*(undefined1 (*) [16])(bytes + uVar5),0);
      uVar7 = in_ZMM0._0_4_;
      auVar2 = vpshufb_avx(*(undefined1 (*) [16])(bytes + uVar5),
                           *(undefined1 (*) [16])("" + ((uVar7 & 0x7fff) << 4)));
      in_ZMM0 = ZEXT1664(auVar2);
      *(undefined1 (*) [16])(bytes + sVar3) = auVar2;
      sVar3 = (long)(0x10 - POPCOUNT(uVar7)) + sVar3;
      uVar4 = uVar5 + 0x10;
      uVar6 = uVar5 + 0x1f;
      uVar5 = uVar4;
    } while (uVar6 < howmany);
  }
  if (uVar4 < howmany) {
    do {
      bVar1 = bytes[uVar4];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        bytes[sVar3] = bVar1;
        sVar3 = sVar3 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (howmany != uVar4);
  }
  return sVar3;
}

Assistant:

size_t sse42_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16 = _mm_cvtsi128_si32(
        _mm_cmpestrm(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK));
    x = _mm_shuffle_epi8(
        x, _mm_loadu_si128((const __m128i *)despace_mask16 + (mask16 & 0x7fff)));
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}